

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeString(Parser *this,string *output,char *error)

{
  char *__s;
  bool bVar1;
  Token *pTVar2;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *error_local;
  string *output_local;
  Parser *this_local;
  
  local_28 = error;
  error_local = (char *)output;
  output_local = (string *)this;
  bVar1 = LookingAtType(this,TYPE_STRING);
  __s = local_28;
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(this->input_);
    io::Tokenizer::ParseString(&pTVar2->text,(string *)error_local);
    io::Tokenizer::Next(this->input_);
    while( true ) {
      bVar1 = LookingAtType(this,TYPE_STRING);
      if (!bVar1) break;
      pTVar2 = io::Tokenizer::current(this->input_);
      io::Tokenizer::ParseStringAppend(&pTVar2->text,(string *)error_local);
      io::Tokenizer::Next(this->input_);
    }
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
    AddError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ConsumeString(string* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    io::Tokenizer::ParseString(input_->current().text, output);
    input_->Next();
    // Allow C++ like concatenation of adjacent string tokens.
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(input_->current().text, output);
      input_->Next();
    }
    return true;
  } else {
    AddError(error);
    return false;
  }
}